

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyxml2.cpp
# Opt level: O2

XMLError __thiscall tinyxml2::XMLElement::QueryFloatText(XMLElement *this,float *fval)

{
  XMLNode *pXVar1;
  bool bVar2;
  int iVar3;
  undefined4 extraout_var;
  char *str;
  XMLError XVar4;
  
  pXVar1 = (this->super_XMLNode)._firstChild;
  XVar4 = XML_NO_TEXT_NODE;
  if (pXVar1 != (XMLNode *)0x0) {
    iVar3 = (*pXVar1->_vptr_XMLNode[7])();
    if (CONCAT44(extraout_var,iVar3) != 0) {
      str = XMLNode::Value((this->super_XMLNode)._firstChild);
      bVar2 = XMLUtil::ToFloat(str,fval);
      XVar4 = (uint)!bVar2 << 4;
    }
  }
  return XVar4;
}

Assistant:

XMLError XMLElement::QueryFloatText( float* fval ) const
{
    if ( FirstChild() && FirstChild()->ToText() ) {
        const char* t = FirstChild()->Value();
        if ( XMLUtil::ToFloat( t, fval ) ) {
            return XML_SUCCESS;
        }
        return XML_CAN_NOT_CONVERT_TEXT;
    }
    return XML_NO_TEXT_NODE;
}